

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O1

OSAttribute * __thiscall
SessionObject::getAttribute
          (OSAttribute *__return_storage_ptr__,SessionObject *this,CK_ATTRIBUTE_TYPE type)

{
  mapped_type *ppOVar1;
  MutexLocker lock;
  CK_ATTRIBUTE_TYPE local_30;
  MutexLocker local_28;
  
  local_30 = type;
  MutexLocker::MutexLocker(&local_28,this->objectMutex);
  ppOVar1 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](&this->attributes,&local_30);
  if (*ppOVar1 == (OSAttribute *)0x0) {
    softHSMLog(3,"getAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObject.cpp"
               ,0x48,"The attribute does not exist: 0x%08X",local_30);
    OSAttribute::OSAttribute(__return_storage_ptr__,0);
  }
  else {
    OSAttribute::OSAttribute(__return_storage_ptr__,*ppOVar1);
  }
  MutexLocker::~MutexLocker(&local_28);
  return __return_storage_ptr__;
}

Assistant:

OSAttribute SessionObject::getAttribute(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	OSAttribute* attr = attributes[type];
	if (attr == NULL)
	{
		ERROR_MSG("The attribute does not exist: 0x%08X", type);
		return OSAttribute((unsigned long)0);
	}

	return *attr;
}